

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

int __thiscall Fl_Process::close(Fl_Process *this,int __fd)

{
  int iVar1;
  int ret;
  Fl_Process *this_local;
  
  iVar1 = pclose((FILE *)this->_fpt);
  this->_fpt = (FILE *)0x0;
  return iVar1;
}

Assistant:

int Fl_Process::close() {
#if defined(WIN32)  && !defined(__CYGWIN__)
  if (_fpt) {
    fclose(_fpt);
    clean_close(perr[0]);
    clean_close(pin[1]);
    clean_close(pout[0]);
    _fpt = NULL;
    return 0;
  }
  return -1;
#else
  int ret = ::pclose(_fpt);
  _fpt=NULL;
  return ret;
#endif
}